

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count,N_Vector y,SUNContext sunctx)

{
  undefined8 uVar1;
  SUNNonlinearSolver p_Var2;
  N_Vector in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  N_Vector w;
  SUNNonlinearSolver NLS;
  SUNContext sunctx_local_scope_;
  SUNContext in_stack_ffffffffffffffd8;
  
  uVar1 = N_VNew_SensWrapper(in_EDI,in_RSI);
  p_Var2 = SUNNonlinSol_Newton(in_RDX,in_stack_ffffffffffffffd8);
  N_VDestroy(uVar1);
  return p_Var2;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count, N_Vector y,
                                           SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS;
  N_Vector w;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);
  SUNCheckLastErrNull();

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_Newton(w, sunctx);
  SUNCheckLastErrNull();

  /* free sensitivity vector wrapper */
  N_VDestroy(w);
  SUNCheckLastErrNull();

  /* return NLS object */
  return (NLS);
}